

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_stack_check(ASMState *as,BCReg topslot,IRIns *irp,RegSet allow,ExitNo exitno)

{
  uint uVar1;
  MCode *pMVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  Reg rb;
  
  if (irp == (IRIns *)0x0) {
    uVar5 = 2;
  }
  else {
    uVar5 = (uint)(irp->field_1).r;
  }
  uVar1 = 0;
  if (allow != 0) {
    for (; (allow >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  pMVar2 = as->mcp;
  *(ExitNo *)(pMVar2 + -4) =
       ((exitno & 0x1f) * 4 + *(int *)(as->J->exitstubgroup + (exitno >> 5))) - (int)pMVar2;
  pMVar2[-6] = '\x0f';
  pMVar2[-5] = 0x82;
  as->mcp = pMVar2 + -6;
  uVar4 = (ulong)uVar1;
  if (allow == 0) {
    uVar4 = 0;
  }
  rb = (Reg)uVar4;
  bVar3 = (byte)uVar4;
  if (allow == 0) {
    pMVar2[-7] = '$';
    pMVar2[-8] = bVar3 * '\b' & 0x38 | 4;
    pMVar2[-9] = 0x8b;
    pMVar2[-10] = (byte)(uVar4 >> 1) & 4 | 0x48;
    as->mcp = pMVar2 + -10;
  }
  else {
    as->modset = as->modset | 1 << (bVar3 & 0x1f);
  }
  emit_gri(as,0x838107,rb,topslot << 3);
  if (uVar5 == rb || 0x7f < uVar5) {
    pMVar2 = as->mcp;
    *(int *)(pMVar2 + -4) = *(int *)&as->J + -0xb8;
    pMVar2[-5] = '%';
    pMVar2[-6] = bVar3 * '\b' & 0x38 | 4;
    pMVar2[-7] = '+';
    if ((uVar4 & 8) == 0) {
      pMVar2 = pMVar2 + -7;
    }
    else {
      pMVar2[-8] = 'D';
      pMVar2 = pMVar2 + -8;
    }
  }
  else {
    pMVar2 = as->mcp;
    pMVar2[-1] = ((byte)uVar5 & 7) + bVar3 * '\b' | 0xc0;
    pMVar2[-2] = '+';
    uVar5 = uVar5 >> 3 & 1 | (uint)(uVar4 >> 1) & 4;
    if (uVar5 == 0) {
      pMVar2 = pMVar2 + -2;
    }
    else {
      pMVar2[-3] = (byte)uVar5 | 0x40;
      pMVar2 = pMVar2 + -3;
    }
  }
  as->mcp = pMVar2;
  emit_rmro(as,XO_MOV,rb,rb,0x20);
  pMVar2 = as->mcp;
  *(int *)(pMVar2 + -4) = *(int *)&as->J + -0xc0;
  pMVar2[-5] = '%';
  pMVar2[-6] = bVar3 * '\b' & 0x38 | 4;
  pMVar2[-7] = 0x8b;
  if ((uVar4 & 8) == 0) {
    pMVar2 = pMVar2 + -7;
  }
  else {
    pMVar2[-8] = 'D';
    pMVar2 = pMVar2 + -8;
  }
  as->mcp = pMVar2;
  if (allow == 0) {
    pMVar2[-1] = '$';
    pMVar2[-2] = bVar3 * '\b' & 0x38 | 4;
    pMVar2[-3] = 0x89;
    pMVar2[-4] = bVar3 >> 1 & 4 | 0x48;
    as->mcp = pMVar2 + -4;
  }
  return;
}

Assistant:

static void asm_stack_check(ASMState *as, BCReg topslot,
			    IRIns *irp, RegSet allow, ExitNo exitno)
{
  /* Try to get an unused temp. register, otherwise spill/restore eax. */
  Reg pbase = irp ? irp->r : RID_BASE;
  Reg r = allow ? rset_pickbot(allow) : RID_EAX;
  emit_jcc(as, CC_B, exitstub_addr(as->J, exitno));
  if (allow == RSET_EMPTY)  /* Restore temp. register. */
    emit_rmro(as, XO_MOV, r|REX_64, RID_ESP, 0);
  else
    ra_modified(as, r);
  emit_gri(as, XG_ARITHi(XOg_CMP), r|REX_GC64, (int32_t)(8*topslot));
  if (ra_hasreg(pbase) && pbase != r)
    emit_rr(as, XO_ARITH(XOg_SUB), r|REX_GC64, pbase);
  else
#if LJ_GC64
    emit_rmro(as, XO_ARITH(XOg_SUB), r|REX_64, RID_DISPATCH,
	      (int32_t)dispofs(as, &J2G(as->J)->jit_base));
#else
    emit_rmro(as, XO_ARITH(XOg_SUB), r, RID_NONE,
	      ptr2addr(&J2G(as->J)->jit_base));
#endif
  emit_rmro(as, XO_MOV, r|REX_GC64, r, offsetof(lua_State, maxstack));
  emit_getgl(as, r, cur_L);
  if (allow == RSET_EMPTY)  /* Spill temp. register. */
    emit_rmro(as, XO_MOVto, r|REX_64, RID_ESP, 0);
}